

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>
               (string *type,Module *m)

{
  Type_Info ti;
  Module *pMVar1;
  allocator<char> local_3e1;
  string local_3e0;
  anon_class_1_0_00000001_for_m_f local_3b9;
  Proxy_Function local_3b8;
  allocator<char> local_3a1;
  string local_3a0;
  anon_class_1_0_00000001_for_m_f local_379;
  Proxy_Function local_378;
  allocator<char> local_361;
  string local_360;
  anon_class_1_0_00000001_for_m_f local_339;
  Proxy_Function local_338;
  allocator<char> local_321;
  string local_320;
  anon_class_1_0_00000001_for_m_f local_2f9;
  Proxy_Function local_2f8;
  allocator<char> local_2e1;
  string local_2e0;
  anon_class_1_0_00000001_for_m_f local_2b9;
  Proxy_Function local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  anon_class_1_0_00000001_for_m_f local_279;
  Proxy_Function local_278;
  allocator<char> local_261;
  string local_260;
  anon_class_1_0_00000001_for_m_f local_239;
  Proxy_Function local_238;
  allocator<char> local_221;
  string local_220;
  anon_class_1_0_00000001_for_m_f local_1f9;
  Proxy_Function local_1f8;
  allocator<char> local_1e1;
  string local_1e0;
  anon_class_1_0_00000001_for_m_f local_1b9;
  Proxy_Function local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  anon_class_1_0_00000001_for_m_f local_179;
  Proxy_Function local_178;
  allocator<char> local_161;
  string local_160;
  anon_class_1_0_00000001_for_m_f local_139;
  Proxy_Function local_138;
  allocator<char> local_121;
  string local_120;
  anon_class_1_0_00000001_for_m_f local_f9;
  Proxy_Function local_f8;
  allocator<char> local_e1;
  string local_e0;
  anon_class_1_0_00000001_for_m_f local_b9;
  Proxy_Function local_b8;
  undefined1 local_a1;
  string local_a0;
  code *local_80;
  undefined8 local_78;
  Proxy_Function local_70 [2];
  string local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  Module *local_18;
  Module *m_local;
  string *type_local;
  
  local_18 = m;
  m_local = (Module *)type;
  user_type<std::__cxx11::string>();
  std::__cxx11::string::string
            ((string *)&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)m_local);
  ti.m_bare_type_info = (type_info *)uStack_28;
  ti.m_type_info = (type_info *)local_30;
  ti._16_8_ = local_20;
  Module::add(m,ti,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  operators::addition<std::__cxx11::string>(local_18);
  operators::assign_sum<std::__cxx11::string>(local_18);
  opers_comparison<std::__cxx11::string>(local_18);
  random_access_container_type<std::__cxx11::string>((string *)m_local,local_18);
  sequence_type<std::__cxx11::string>((string *)m_local,local_18);
  default_constructible_type<std::__cxx11::string>((string *)m_local,local_18);
  assignable_type<std::__cxx11::string>((string *)m_local,local_18);
  input_range_type<std::__cxx11::string>((string *)m_local,local_18);
  pMVar1 = local_18;
  local_80 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             push_back;
  local_78 = 0;
  fun<void(std::__cxx11::string::*)(char)>
            ((chaiscript *)local_70,
             (offset_in_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_to_subr *)
             &local_80);
  string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::{lambda()#1}::
  operator()[abi_cxx11_(&local_a0,&local_a1);
  Module::add(pMVar1,local_70,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_70);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_>
            ((chaiscript *)&local_b8,&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"find",&local_e1);
  Module::add(pMVar1,&local_b8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_b8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_>
            ((chaiscript *)&local_f8,&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfind",&local_121);
  Module::add(pMVar1,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_f8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_>
            ((chaiscript *)&local_138,&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"find_first_of",&local_161);
  Module::add(pMVar1,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_138);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_>
            ((chaiscript *)&local_178,&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"find_last_of",&local_1a1)
  ;
  Module::add(pMVar1,&local_178,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_178);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_>
            ((chaiscript *)&local_1b8,&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"find_last_not_of",&local_1e1);
  Module::add(pMVar1,&local_1b8,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1b8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_>
            ((chaiscript *)&local_1f8,&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"find_first_not_of",&local_221);
  Module::add(pMVar1,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1f8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*,char)_1_>
            ((chaiscript *)&local_238,&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"+=",&local_261);
  Module::add(pMVar1,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_238);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string*)_1_>
            ((chaiscript *)&local_278,&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"clear",&local_2a1);
  Module::add(pMVar1,&local_278,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_278);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_1_>
            ((chaiscript *)&local_2b8,&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"empty",&local_2e1);
  Module::add(pMVar1,&local_2b8,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2b8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_2_>
            ((chaiscript *)&local_2f8,&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"size",&local_321);
  Module::add(pMVar1,&local_2f8,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2f8);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_3_>
            ((chaiscript *)&local_338,&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"c_str",&local_361);
  Module::add(pMVar1,&local_338,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_338);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*)_4_>
            ((chaiscript *)&local_378,&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"data",&local_3a1);
  Module::add(pMVar1,&local_378,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_378);
  pMVar1 = local_18;
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_>
            ((chaiscript *)&local_3b8,&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"substr",&local_3e1);
  Module::add(pMVar1,&local_3b8,&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3b8);
  return;
}

Assistant:

void string_type(const std::string &type, Module &m) {
    m.add(user_type<String>(), type);
    operators::addition<String>(m);
    operators::assign_sum<String>(m);
    opers_comparison<String>(m);
    random_access_container_type<String>(type, m);
    sequence_type<String>(type, m);
    default_constructible_type<String>(type, m);
    // container_type<String>(type, m);
    assignable_type<String>(type, m);
    input_range_type<String>(type, m);

    // Special case: add push_back to string (which doesn't support other back_insertion operations
    m.add(fun(&String::push_back), []() -> std::string {
      if (typeid(typename String::value_type) == typeid(Boxed_Value)) {
        return "push_back_ref";
      } else {
        return "push_back";
      }
    }());

    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find(f, pos); }), "find");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->rfind(f, pos); }), "rfind");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_of(f, pos); }), "find_first_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_of(f, pos); }), "find_last_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_not_of(f, pos); }), "find_last_not_of");
    m.add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_not_of(f, pos); }), "find_first_not_of");

    m.add(fun([](String *s, typename String::value_type c) -> decltype(auto) { return (*s += c); }), "+=");

    m.add(fun([](String *s) { s->clear(); }), "clear");
    m.add(fun([](const String *s) { return s->empty(); }), "empty");
    m.add(fun([](const String *s) { return s->size(); }), "size");

    m.add(fun([](const String *s) { return s->c_str(); }), "c_str");
    m.add(fun([](const String *s) { return s->data(); }), "data");
    m.add(fun([](const String *s, size_t pos, size_t len) { return s->substr(pos, len); }), "substr");
  }